

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O2

void luaK_patchclose(FuncState *fs,int list,int level)

{
  Instruction *pIVar1;
  
  for (; list != -1; list = getjump(fs,list)) {
    pIVar1 = fs->f->code;
    pIVar1[list] = pIVar1[list] & 0xffffc03f | level * 0x40 + 0x40U & 0x3fc0;
  }
  return;
}

Assistant:

void luaK_patchclose(FuncState *fs, int list, int level) {
    level++;  /* argument is +1 to reserve 0 as non-op */
    for (; list != NO_JUMP; list = getjump(fs, list)) {
        lua_assert(GET_OPCODE(fs->f->code[list]) == OP_JMP &&
                   (GETARG_A(fs->f->code[list]) == 0 ||
                    GETARG_A(fs->f->code[list]) >= level));
        SETARG_A(fs->f->code[list], level);
    }
}